

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O2

void __thiscall
setup::info::load_entries<setup::message_entry>
          (info *this,istream *is,entry_types entries,size_t count,
          vector<setup::message_entry,_std::allocator<setup::message_entry>_> *result,
          enum_type entry_type)

{
  _Base_bitset<1UL> _Var1;
  long lVar2;
  bool bVar3;
  message_entry entry;
  message_entry local_80;
  flags<setup::info::entry_types_Enum_,_21UL> local_38;
  
  local_38._flags.super__Base_bitset<1UL>._M_w = entries._flags.super__Base_bitset<1UL>._M_w;
  std::vector<setup::message_entry,_std::allocator<setup::message_entry>_>::clear(result);
  _Var1._M_w = (_WordT)flags<setup::info::entry_types_Enum_,_21UL>::operator&(&local_38,entry_type);
  if ((_Base_bitset<1UL>)_Var1._M_w == (_Base_bitset<1UL>)0x0) {
    while (bVar3 = count != 0, count = count - 1, bVar3) {
      local_80.name._M_dataplus._M_p = (pointer)&local_80.name.field_2;
      local_80.name._M_string_length = 0;
      local_80.name.field_2._M_local_buf[0] = '\0';
      local_80.value._M_string_length = 0;
      local_80.value.field_2._M_local_buf[0] = '\0';
      local_80.value._M_dataplus._M_p = (pointer)&local_80.value.field_2;
      message_entry::load(&local_80,is,this);
      message_entry::~message_entry(&local_80);
    }
  }
  else {
    std::vector<setup::message_entry,_std::allocator<setup::message_entry>_>::resize(result,count);
    lVar2 = 0;
    while (bVar3 = count != 0, count = count - 1, bVar3) {
      message_entry::load((message_entry *)
                          ((long)&(((result->
                                    super__Vector_base<setup::message_entry,_std::allocator<setup::message_entry>_>
                                    )._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus.
                                  _M_p + lVar2),is,this);
      lVar2 = lVar2 + 0x48;
    }
  }
  return;
}

Assistant:

void info::load_entries(std::istream & is, entry_types entries, size_t count,
                        std::vector<Entry> & result, entry_types::enum_type entry_type) {
	
	result.clear();
	if(entries & entry_type) {
		result.resize(count);
		for(size_t i = 0; i < count; i++) {
			result[i].load(is, *this);
		}
	} else {
		for(size_t i = 0; i < count; i++) {
			Entry entry;
			entry.load(is, *this);
		}
	}
}